

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzbase.h
# Opt level: O0

void __thiscall
lzham::CLZBase::compute_lzx_position_slot(CLZBase *this,uint dist,uint *slot,uint *ofs)

{
  uint s;
  uint *ofs_local;
  uint *slot_local;
  uint dist_local;
  CLZBase *this_local;
  
  if (dist < 0x1000) {
    s = (uint)this->m_slot_tab0[dist];
  }
  else if (dist < 0x100000) {
    s = (uint)this->m_slot_tab1[dist >> 0xb];
  }
  else if (dist < 0x1000000) {
    s = (uint)this->m_slot_tab2[dist >> 0x10];
  }
  else if (dist < 0x2000000) {
    s = (dist - 0x1000000 >> 0x17) + 0x30;
  }
  else if (dist < 0x4000000) {
    s = (dist + 0xfe000000 >> 0x18) + 0x32;
  }
  else {
    s = (dist + 0xfc000000 >> 0x19) + 0x34;
  }
  *ofs = dist - (this->super_CLZDecompBase).m_lzx_position_base[s] &
         (this->super_CLZDecompBase).m_lzx_position_extra_mask[s];
  *slot = s;
  return;
}

Assistant:

inline void compute_lzx_position_slot(uint dist, uint& slot, uint& ofs)
      {
         uint s;
         if (dist < 0x1000)
            s = m_slot_tab0[dist];
         else if (dist < 0x100000)
            s = m_slot_tab1[dist >> 11];
         else if (dist < 0x1000000)
            s = m_slot_tab2[dist >> 16];
         else if (dist < 0x2000000)
            s = 48 + ((dist - 0x1000000) >> 23);
         else if (dist < 0x4000000)
            s = 50 + ((dist - 0x2000000) >> 24);
         else 
            s = 52 + ((dist - 0x4000000) >> 25);

         ofs = (dist - m_lzx_position_base[s]) & m_lzx_position_extra_mask[s];
         slot = s;

         LZHAM_ASSERT(s < m_num_lzx_slots);
         LZHAM_ASSERT((m_lzx_position_base[slot] + ofs) == dist);
         LZHAM_ASSERT(ofs < (1U << m_lzx_position_extra_bits[slot]));
      }